

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestChdirErrors::~ParserTestChdirErrors(ParserTestChdirErrors *this)

{
  ParserTestChdirErrors *this_local;
  
  ~ParserTestChdirErrors(this);
  operator_delete(this,0x248);
  return;
}

Assistant:

TEST_F(ParserTest, ChdirErrors) {
  {
    // Test an invalid ParseLet line (should be chdir = test-a)
    VirtualFileSystem fs;
    fs.MakeDir("test-a");
    fs.Create("test-a/a.ninja",
      "rule cat\n"
      "  command = cat $in > $out\n"
      "build out2: cat in1\n"
      "build out1: cat in2\n"
      "build final: cat out1\n");
    State local_state;
    ManifestParser parser(&local_state, &fs);
    string err;
    EXPECT_FALSE(parser.ParseTest(
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
"default foo\n"
"\n"
"subninja a.ninja\n"
"    chdir test-a\n", &err));
    EXPECT_EQ("input:9: expected '=', got identifier\n"
              "    chdir test-a\n"
              "          ^ near here"
              , err);
    EXPECT_EQ("/", VerifyCwd(fs));  // Verify cwd was restored
  }

  {
    // Test duplicate chdir lets (only one is allowed)
    VirtualFileSystem fs;
    fs.MakeDir("test-a");
    fs.Create("test-a/a.ninja",
      "rule cat\n"
      "  command = cat $in > $out\n"
      "build out2: cat in1\n"
      "build out1: cat in2\n"
      "build final: cat out1\n");
    State local_state;
    ManifestParser parser(&local_state, &fs);
    string err;
    EXPECT_FALSE(parser.ParseTest(
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
"default foo\n"
"\n"
"subninja a.ninja\n"
"    chdir = test-a\n"
"    chdir = test-b\n", &err));
    EXPECT_EQ("input:10: duplicate 'chdir' in subninja\n"
              "    chdir = test-b\n"
              "                  ^ near here"
              , err);
    EXPECT_EQ("/", VerifyCwd(fs));  // Verify cwd was restored
  }

  {
    // Test an invalid let (only chdir is allowed)
    VirtualFileSystem fs;
    fs.MakeDir("test-a");
    fs.Create("test-a/a.ninja",
      "rule cat\n"
      "  command = cat $in > $out\n"
      "build out2: cat in1\n"
      "build out1: cat in2\n"
      "build final: cat out1\n");
    State local_state;
    ManifestParser parser(&local_state, &fs);
    string err;
    EXPECT_FALSE(parser.ParseTest(
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
"default foo\n"
"\n"
"subninja a.ninja\n"
"    chdir = test-a\n"
"    foo = test-b\n", &err));
    EXPECT_EQ("input:10: illegal key 'foo' (only 'chdir' is supported)\n"
              "    foo = test-b\n"
              "                ^ near here"
              , err);
    EXPECT_EQ("/", VerifyCwd(fs));  // Verify cwd was restored
  }

  {
    // Test chdir failure
    VirtualFileSystem fs;
    fs.MakeDir("test-a");
    fs.Create("test-a/a.ninja",
      "rule cat\n"
      "  command = cat $in > $out\n"
      "build out2: cat in1\n"
      "build out1: cat in2\n"
      "build final: cat out1\n");
    State local_state;
    ManifestParser parser(&local_state, &fs);
    string err;
    EXPECT_FALSE(parser.ParseTest(
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
"default foo\n"
"\n"
"subninja a.ninja\n"
"    chdir = test-b\n", &err));
    EXPECT_EQ("Chdir to 'test-b': No such file or directory", err);
    EXPECT_EQ("/", VerifyCwd(fs));  // Verify cwd was restored
  }

  {
    // Test that an error in a.ninja flows through the chdir.
    // Verify that 'unknown target' includes the chdir in the message.
    VirtualFileSystem fs;
    fs.MakeDir("test-a");
    fs.Create("test-a/a.ninja",
      "rule cat\n"
      "  command = cat $in > $out\n"
      "build out2: cat in1\n"
      "build out1: cat in2\n"
      "build final: cat out1\n"
      "default somethingweird\n");
    ManifestParserOptions parser_opts;
    parser_opts.dupe_edge_action_ = kDupeEdgeActionError;
    State local_state;
    ManifestParser parser(&local_state, &fs, parser_opts);
    string err;
    EXPECT_FALSE(parser.ParseTest(
"rule pipe-through-test-a\n"
"    command = $in | test-a/final > $out\n"
"\n"
"build foo: pipe-through-test-a | test-a/final\n"
"\n"
"default foo\n"
"\n"
"subninja a.ninja\n"
"    chdir = test-a\n", &err));
    EXPECT_EQ("a.ninja:6: unknown target test-a/'somethingweird'\n"
              "default somethingweird\n"
              "                      ^ near here"
              , err);
    EXPECT_EQ("/", VerifyCwd(fs));  // Verify cwd was restored
  }
}